

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

char __thiscall Fl_Help_View::begin_selection(Fl_Help_View *this)

{
  Window WVar1;
  Fl_Surface_Device *pFVar2;
  Fl_Display_Device *pFVar3;
  
  clear_global_selection(this);
  if (fl_help_view_buffer == 0) {
    fl_help_view_buffer =
         XCreatePixmap(fl_display,
                       *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80)
                       ,1,1,fl_visual->depth);
  }
  WVar1 = fl_window;
  mouse_x = Fl::e_x;
  mouse_y = Fl::e_y;
  draw_mode = 1;
  fl_window = fl_help_view_buffer;
  pFVar2 = Fl_Surface_Device::_surface;
  current_view = this;
  if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
    pFVar2 = Fl_Surface_Device::default_surface();
  }
  pFVar3 = Fl_Display_Device::display_device();
  (*(pFVar3->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar3);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[2])(this);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = WVar1;
  (*(pFVar2->super_Fl_Device)._vptr_Fl_Device[3])(pFVar2);
  draw_mode = 0;
  return selection_push_last != 0;
}

Assistant:

char Fl_Help_View::begin_selection()
{
  clear_global_selection();

  if (!fl_help_view_buffer) fl_help_view_buffer = fl_create_offscreen(1, 1);

  mouse_x = Fl::event_x();
  mouse_y = Fl::event_y();
  draw_mode = 1;

    current_view = this;
    fl_begin_offscreen(fl_help_view_buffer);
    draw();
    fl_end_offscreen();

  draw_mode = 0;

  if (selection_push_last) return 1;
  else return 0;
}